

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentQLearner.cpp
# Opt level: O0

void __thiscall AgentQLearner::AgentQLearner(AgentQLearner *this,AgentQLearner *a)

{
  QTable *pQVar1;
  undefined1 uVar2;
  undefined3 uVar3;
  QTable *in_RSI;
  AgentDecPOMDPDiscrete *in_RDI;
  AgentDecPOMDPDiscrete *in_stack_ffffffffffffffe0;
  QTable *in_stack_ffffffffffffffe8;
  
  AgentDecPOMDPDiscrete::AgentDecPOMDPDiscrete(in_stack_ffffffffffffffe0,in_RDI);
  AgentFullyObservable::AgentFullyObservable
            ((AgentFullyObservable *)in_RDI,&PTR_construction_vtable_24__00d0e2c8,
             (AgentFullyObservable *)in_RSI);
  (in_RDI->super_SimulationAgent)._vptr_SimulationAgent = (_func_int **)0xd0e218;
  in_RDI[5].super_SimulationAgent._m_id = 0xd0e280;
  in_RDI[5].super_SimulationAgent._m_verbose = false;
  *(undefined3 *)&in_RDI[5].super_SimulationAgent.field_0xd = 0;
  QTable::QTable(in_RSI,in_stack_ffffffffffffffe8);
  in_RDI[2].super_SimulationAgent._m_id = (Index)in_RSI[1].super_matrix_t.size1_;
  *(undefined4 *)&in_RDI[2].super_SimulationAgent._m_verbose =
       *(undefined4 *)((long)&in_RSI[1].super_matrix_t.size1_ + 4);
  in_RDI[2]._m_pu = (PlanningUnitDecPOMDPDiscrete *)in_RSI[1].super_matrix_t.size2_;
  in_RDI[3].super_SimulationAgent._vptr_SimulationAgent =
       *(_func_int ***)&in_RSI[1].super_matrix_t.data_;
  pQVar1 = in_RSI + 1;
  uVar2 = *(undefined1 *)((long)&(pQVar1->super_matrix_t).data_.size_ + 4);
  uVar3 = *(undefined3 *)((long)&(pQVar1->super_matrix_t).data_.size_ + 5);
  in_RDI[3].super_SimulationAgent._m_id = *(undefined4 *)&(pQVar1->super_matrix_t).data_.size_;
  in_RDI[3].super_SimulationAgent._m_verbose = (bool)uVar2;
  *(undefined3 *)&in_RDI[3].super_SimulationAgent.field_0xd = uVar3;
  *(undefined4 *)&in_RDI[3]._m_pu = *(undefined4 *)&in_RSI[1].super_matrix_t.data_.data_;
  in_RDI[4].super_SimulationAgent._vptr_SimulationAgent =
       in_RSI[2].super_QTableInterface._vptr_QTableInterface;
  uVar2 = *(undefined1 *)((long)&in_RSI[2].super_matrix_t.size1_ + 4);
  uVar3 = *(undefined3 *)((long)&in_RSI[2].super_matrix_t.size1_ + 5);
  in_RDI[4].super_SimulationAgent._m_id = *(undefined4 *)&in_RSI[2].super_matrix_t.size1_;
  in_RDI[4].super_SimulationAgent._m_verbose = (bool)uVar2;
  *(undefined3 *)&in_RDI[4].super_SimulationAgent.field_0xd = uVar3;
  in_RDI[4]._m_pu = (PlanningUnitDecPOMDPDiscrete *)in_RSI[2].super_matrix_t.size2_;
  in_RDI[5].super_SimulationAgent._vptr_SimulationAgent =
       *(_func_int ***)&in_RSI[2].super_matrix_t.data_;
  return;
}

Assistant:

AgentQLearner::AgentQLearner(const AgentQLearner& a) :
    AgentDecPOMDPDiscrete(a),
    AgentFullyObservable(a),
    _m_Q(a._m_Q),
    _m_selJaI(a._m_selJaI),
    _m_prevSI(a._m_prevSI),
    _m_alpha(a._m_alpha),
    _m_gamma(a._m_gamma),
    _m_initValue(a._m_initValue),
    _m_exploration(a._m_exploration),
    _m_epsilon(a._m_epsilon),
    _m_temp(a._m_temp),
    _m_firstAgent(a._m_firstAgent),
    _m_t(a._m_t)
{
}